

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O3

result_type time_plain<trng::mrg5s>(mrg5s *r)

{
  long lVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  string res;
  string local_58;
  double local_38;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  iVar2 = 0;
  lVar9 = 0x1000000;
  iVar5 = (r->S).r[0];
  iVar4 = (r->S).r[1];
  iVar10 = (r->S).r[2];
  iVar6 = (r->S).r[3];
  iVar8 = (r->S).r[4];
  do {
    iVar7 = iVar6;
    iVar6 = iVar10;
    iVar10 = iVar4;
    iVar4 = iVar5;
    uVar3 = (long)iVar7 * (long)(r->P).a[3] + (long)iVar6 * (long)(r->P).a[2] +
            (long)iVar10 * (long)(r->P).a[1] + (long)iVar4 * (long)(r->P).a[0];
    uVar11 = uVar3 + 0x8000b0e1c2e43c3e;
    if (uVar3 < 0x7fff4f1e3d1bc3c2) {
      uVar11 = uVar3;
    }
    uVar11 = (long)iVar8 * (long)(r->P).a[4] + uVar11;
    uVar11 = (uVar11 >> 0x1f) * -0x7fffa78f + uVar11;
    uVar11 = (uVar11 >> 0x1f) * -0x7fffa78f + uVar11;
    iVar8 = (int)uVar11;
    iVar5 = iVar8 + -0x7fffa78f;
    if (uVar11 < 0x7fffa78f) {
      iVar5 = iVar8;
    }
    iVar2 = iVar2 + iVar5;
    lVar9 = lVar9 + -1;
    iVar8 = iVar7;
  } while (lVar9 != 0);
  (r->S).r[0] = iVar5;
  (r->S).r[1] = iVar4;
  (r->S).r[2] = iVar10;
  (r->S).r[3] = iVar6;
  (r->S).r[4] = iVar7;
  lVar9 = std::chrono::_V2::system_clock::now();
  local_38 = 16.777216 / ((double)((lVar9 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_58,&local_38);
  while (local_58._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_58);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_58._M_dataplus._M_p,local_58._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return iVar2;
}

Assistant:

typename R::result_type time_plain(R &r) {
  typename R::result_type s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += r();
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}